

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dotdot.c
# Opt level: O0

char * Curl_dedotdotify(char *input)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  size_t oindex;
  size_t qlen;
  char *queryp;
  char *orgclone;
  char *outptr;
  char *out;
  size_t clen;
  char *clone;
  size_t inlen;
  char *input_local;
  
  sVar2 = strlen(input);
  input_local = (char *)(*Curl_cmalloc)(sVar2 + 1);
  if (input_local == (char *)0x0) {
    input_local = (char *)0x0;
  }
  else {
    *input_local = '\0';
    __s = (*Curl_cstrdup)(input);
    if (__s == (char *)0x0) {
      (*Curl_cfree)(input_local);
      input_local = (char *)0x0;
    }
    else if (*__s == '\0') {
      (*Curl_cfree)(input_local);
      input_local = __s;
    }
    else {
      pcVar3 = strchr(__s,0x3f);
      orgclone = input_local;
      clen = (size_t)__s;
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
      }
      do {
        iVar1 = strncmp("./",(char *)clen,2);
        if (iVar1 == 0) {
          clen = clen + 2;
        }
        else {
          iVar1 = strncmp("../",(char *)clen,3);
          if (iVar1 == 0) {
            clen = clen + 3;
          }
          else {
            iVar1 = strncmp("/./",(char *)clen,3);
            if (iVar1 == 0) {
              clen = clen + 2;
            }
            else {
              iVar1 = strcmp("/.",(char *)clen);
              if (iVar1 == 0) {
                *(undefined1 *)(clen + 1) = 0x2f;
                clen = clen + 1;
              }
              else {
                iVar1 = strncmp("/../",(char *)clen,4);
                if (iVar1 == 0) {
                  do {
                    if (orgclone <= input_local) break;
                    orgclone = orgclone + -1;
                  } while (*orgclone != '/');
                  *orgclone = '\0';
                  clen = clen + 3;
                }
                else {
                  iVar1 = strcmp("/..",(char *)clen);
                  if (iVar1 == 0) {
                    *(undefined1 *)(clen + 2) = 0x2f;
                    do {
                      if (orgclone <= input_local) break;
                      orgclone = orgclone + -1;
                    } while (*orgclone != '/');
                    *orgclone = '\0';
                    clen = clen + 2;
                  }
                  else {
                    iVar1 = strcmp(".",(char *)clen);
                    if ((iVar1 == 0) || (iVar1 = strcmp("..",(char *)clen), iVar1 == 0)) {
                      *(undefined1 *)clen = 0;
                      *input_local = '\0';
                    }
                    else {
                      do {
                        pcVar4 = (char *)(clen + 1);
                        pcVar5 = orgclone + 1;
                        *orgclone = *(char *)clen;
                        bVar6 = false;
                        if (*pcVar4 != '\0') {
                          bVar6 = *pcVar4 != '/';
                        }
                        orgclone = pcVar5;
                        clen = (size_t)pcVar4;
                      } while (bVar6);
                      *pcVar5 = '\0';
                    }
                  }
                }
              }
            }
          }
        }
      } while (*(char *)clen != '\0');
      if (pcVar3 != (char *)0x0) {
        sVar2 = strlen(input + ((long)pcVar3 - (long)__s));
        memcpy(orgclone,input + ((long)pcVar3 - (long)__s),sVar2 + 1);
      }
      (*Curl_cfree)(__s);
    }
  }
  return input_local;
}

Assistant:

char *Curl_dedotdotify(const char *input)
{
  size_t inlen = strlen(input);
  char *clone;
  size_t clen = inlen; /* the length of the cloned input */
  char *out = malloc(inlen + 1);
  char *outptr;
  char *orgclone;
  char *queryp;
  if(!out)
    return NULL; /* out of memory */

  *out = 0; /* zero terminates, for inputs like "./" */

  /* get a cloned copy of the input */
  clone = strdup(input);
  if(!clone) {
    free(out);
    return NULL;
  }
  orgclone = clone;
  outptr = out;

  if(!*clone) {
    /* zero length string, return that */
    free(out);
    return clone;
  }

  /*
   * To handle query-parts properly, we must find it and remove it during the
   * dotdot-operation and then append it again at the end to the output
   * string.
   */
  queryp = strchr(clone, '?');
  if(queryp)
    *queryp = 0;

  do {

    /*  A.  If the input buffer begins with a prefix of "../" or "./", then
        remove that prefix from the input buffer; otherwise, */

    if(!strncmp("./", clone, 2)) {
      clone += 2;
      clen -= 2;
    }
    else if(!strncmp("../", clone, 3)) {
      clone += 3;
      clen -= 3;
    }

    /*  B.  if the input buffer begins with a prefix of "/./" or "/.", where
        "."  is a complete path segment, then replace that prefix with "/" in
        the input buffer; otherwise, */
    else if(!strncmp("/./", clone, 3)) {
      clone += 2;
      clen -= 2;
    }
    else if(!strcmp("/.", clone)) {
      clone[1]='/';
      clone++;
      clen -= 1;
    }

    /*  C.  if the input buffer begins with a prefix of "/../" or "/..", where
        ".." is a complete path segment, then replace that prefix with "/" in
        the input buffer and remove the last segment and its preceding "/" (if
        any) from the output buffer; otherwise, */

    else if(!strncmp("/../", clone, 4)) {
      clone += 3;
      clen -= 3;
      /* remove the last segment from the output buffer */
      while(outptr > out) {
        outptr--;
        if(*outptr == '/')
          break;
      }
      *outptr = 0; /* zero-terminate where it stops */
    }
    else if(!strcmp("/..", clone)) {
      clone[2]='/';
      clone += 2;
      clen -= 2;
      /* remove the last segment from the output buffer */
      while(outptr > out) {
        outptr--;
        if(*outptr == '/')
          break;
      }
      *outptr = 0; /* zero-terminate where it stops */
    }

    /*  D.  if the input buffer consists only of "." or "..", then remove
        that from the input buffer; otherwise, */

    else if(!strcmp(".", clone) || !strcmp("..", clone)) {
      *clone = 0;
      *out = 0;
    }

    else {
      /*  E.  move the first path segment in the input buffer to the end of
          the output buffer, including the initial "/" character (if any) and
          any subsequent characters up to, but not including, the next "/"
          character or the end of the input buffer. */

      do {
        *outptr++ = *clone++;
        clen--;
      } while(*clone && (*clone != '/'));
      *outptr = 0;
    }

  } while(*clone);

  if(queryp) {
    size_t qlen;
    /* There was a query part, append that to the output. The 'clone' string
       may now have been altered so we copy from the original input string
       from the correct index. */
    size_t oindex = queryp - orgclone;
    qlen = strlen(&input[oindex]);
    memcpy(outptr, &input[oindex], qlen + 1); /* include the end zero byte */
  }

  free(orgclone);
  return out;
}